

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall TransferFunctionITU::~TransferFunctionITU(TransferFunctionITU *this)

{
  void *in_RDI;
  
  ~TransferFunctionITU((TransferFunctionITU *)0x15c858);
  operator_delete(in_RDI,0x18);
  return;
}

Assistant:

float encode(const float intensity) const override {
        float brightness;

        if (intensity < linearCutoff_)
            brightness = intensity * linearExpansion_;
        else
            brightness = 1.099f * pow(intensity, oeGamma_) - 0.099f;

        return brightness;
    }